

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

float pbrt::Clamp<float,int,int>(float val,int low,int high)

{
  int high_local;
  int low_local;
  float val_local;
  float local_4;
  
  if ((float)low <= val) {
    local_4 = val;
    if ((float)high < val) {
      local_4 = (float)high;
    }
  }
  else {
    local_4 = (float)low;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU inline constexpr T Clamp(T val, U low, V high) {
    if (val < low)
        return low;
    else if (val > high)
        return high;
    else
        return val;
}